

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O2

int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  long lVar2;
  int iVar3;
  
  Abc_NtkFillTemp(pNtk);
  for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkPi(pNtk,iVar3);
    (pAVar1->field_5).iData = iVar3;
  }
  for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkPo(pNtk,iVar3);
    (pAVar1->field_5).iData = iVar3;
  }
  iVar3 = 0;
  while( true ) {
    if (pNtk->vBoxes->nSize <= iVar3) {
      return pNtk->vPos->nSize + pNtk->vPis->nSize;
    }
    pAVar1 = Abc_NtkBox(pNtk,iVar3);
    if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) break;
    for (lVar2 = 0; lVar2 < (pAVar1->vFanins).nSize; lVar2 = lVar2 + 1) {
      *(int *)((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar2]] + 0x38) =
           (int)lVar2;
    }
    for (lVar2 = 0; lVar2 < (pAVar1->vFanouts).nSize; lVar2 = lVar2 + 1) {
      *(int *)((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanouts).pArray[lVar2]] + 0x38) =
           (int)lVar2;
    }
    iVar3 = iVar3 + 1;
  }
  __assert_fail("!Abc_ObjIsLatch(pBox)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                ,0x16e,"int Gia_ManFlattenLogicPrepare(Abc_Ntk_t *)");
}

Assistant:

int Gia_ManFlattenLogicPrepare( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pTerm, * pBox; 
    int i, k;
    Abc_NtkFillTemp( pNtk );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iData = i;
    Abc_NtkForEachBox( pNtk, pBox, i )
    {
        assert( !Abc_ObjIsLatch(pBox) );
        Abc_ObjForEachFanin( pBox, pTerm, k )
            pTerm->iData = k;
        Abc_ObjForEachFanout( pBox, pTerm, k )
            pTerm->iData = k;
    }
    return Abc_NtkPiNum(pNtk) + Abc_NtkPoNum(pNtk);
}